

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::remove_torrent
          (session_impl *this,torrent_handle *h,remove_flags_t options)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<libtorrent::aux::torrent> local_58 [2];
  undefined4 local_34;
  undefined1 local_30 [8];
  shared_ptr<libtorrent::aux::torrent> tptr;
  torrent_handle *h_local;
  session_impl *this_local;
  remove_flags_t options_local;
  
  tptr.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)h;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_30);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    bVar1 = torrent::is_added(peVar2);
    if (bVar1) {
      ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
                (local_58,(shared_ptr<libtorrent::aux::torrent> *)local_30);
      remove_torrent_impl(this,local_58,options);
      ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr(local_58);
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      torrent::abort(peVar2);
      local_34 = 0;
    }
    else {
      local_34 = 1;
    }
  }
  else {
    local_34 = 1;
  }
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_30);
  return;
}

Assistant:

void session_impl::remove_torrent(const torrent_handle& h
		, remove_flags_t const options)
	{
		INVARIANT_CHECK;

		std::shared_ptr<torrent> tptr = h.m_torrent.lock();
		if (!tptr) return;
		if (!tptr->is_added()) return;

		remove_torrent_impl(tptr, options);

		tptr->abort();
	}